

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O2

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadBGFMesh(XMLLoader *this,Ref<embree::XML> *xml)

{
  string *psVar1;
  MaterialNode *pMVar2;
  int iVar3;
  mapped_type *pmVar4;
  TriangleMeshNode *this_00;
  undefined8 *in_RDX;
  long lVar5;
  size_t i;
  ulong uVar6;
  allocator local_91;
  undefined1 local_90 [8];
  atomic<unsigned_long> local_88;
  element_type *local_80;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_78;
  Vec3fa *local_70;
  vector<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_> triangles;
  Ref<embree::SceneGraph::MaterialNode> local_40;
  size_t matid;
  
  psVar1 = (string *)*in_RDX;
  std::__cxx11::string::string((string *)&local_88,"materiallist",(allocator *)local_90);
  XML::child((XML *)&triangles,psVar1);
  iVar3 = Token::Int(*(Token **)
                      ((long)&triangles.
                              super__Vector_base<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[9].field_0 + 8));
  if (triangles.super__Vector_base<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    (**(code **)(*(long *)&(triangles.
                            super__Vector_base<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->field_0 + 0x18))();
  }
  std::__cxx11::string::~string((string *)&local_88);
  matid = (long)iVar3;
  pmVar4 = std::
           map<unsigned_long,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
           ::at((map<unsigned_long,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
                 *)(xml + 0x12),&matid);
  pMVar2 = pmVar4->ptr;
  if (pMVar2 != (MaterialNode *)0x0) {
    (*(pMVar2->super_Node).super_RefCount._vptr_RefCount[2])(pMVar2);
  }
  this_00 = (TriangleMeshNode *)::operator_new(0xd8);
  local_40.ptr = pMVar2;
  if (pMVar2 != (MaterialNode *)0x0) {
    (*(pMVar2->super_Node).super_RefCount._vptr_RefCount[2])(pMVar2);
  }
  SceneGraph::TriangleMeshNode::TriangleMeshNode(this_00,&local_40,(BBox1f)0x3f80000000000000,0);
  (**(code **)((long)(this_00->super_Node).super_RefCount._vptr_RefCount + 0x10))(this_00);
  if (local_40.ptr != (MaterialNode *)0x0) {
    (*((local_40.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  psVar1 = (string *)*in_RDX;
  std::__cxx11::string::string((string *)&triangles,"vertex",&local_91);
  XML::childOpt((XML *)local_90,psVar1);
  loadVec3faArray((avector<Vec3fa> *)&local_88,(XMLLoader *)xml,(Ref<embree::XML> *)local_90);
  std::
  vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
  ::emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
            ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
              *)&this_00->positions,
             (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)&local_88
            );
  alignedFree(local_70);
  local_70 = (Vec3fa *)0x0;
  local_80 = (element_type *)0x0;
  _Stack_78._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (local_90 != (undefined1  [8])0x0) {
    (*((RefCount *)local_90)->_vptr_RefCount[3])();
  }
  std::__cxx11::string::~string((string *)&triangles);
  psVar1 = (string *)*in_RDX;
  std::__cxx11::string::string((string *)&triangles,"normal",&local_91);
  XML::childOpt((XML *)local_90,psVar1);
  loadVec3faArray((avector<Vec3fa> *)&local_88,(XMLLoader *)xml,(Ref<embree::XML> *)local_90);
  std::
  vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
  ::emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
            ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
              *)&this_00->normals,
             (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)&local_88
            );
  alignedFree(local_70);
  local_70 = (Vec3fa *)0x0;
  local_80 = (element_type *)0x0;
  _Stack_78._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (local_90 != (undefined1  [8])0x0) {
    (*((RefCount *)local_90)->_vptr_RefCount[3])();
  }
  std::__cxx11::string::~string((string *)&triangles);
  psVar1 = (string *)*in_RDX;
  std::__cxx11::string::string((string *)&local_88,"texcoord",&local_91);
  XML::childOpt((XML *)local_90,psVar1);
  loadVec2fArray((vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_> *)&triangles,
                 (XMLLoader *)xml,(Ref<embree::XML> *)local_90);
  std::vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>::_M_move_assign
            (&this_00->texcoords,
             (_Vector_base<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_> *)&triangles)
  ;
  std::_Vector_base<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>::~_Vector_base
            ((_Vector_base<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_> *)&triangles)
  ;
  if (local_90 != (undefined1  [8])0x0) {
    (*((RefCount *)local_90)->_vptr_RefCount[3])();
  }
  std::__cxx11::string::~string((string *)&local_88);
  psVar1 = (string *)*in_RDX;
  std::__cxx11::string::string((string *)&local_88,"prim",&local_91);
  XML::childOpt((XML *)local_90,psVar1);
  loadVec4iArray(&triangles,(XMLLoader *)xml,(Ref<embree::XML> *)local_90);
  if (local_90 != (undefined1  [8])0x0) {
    (*((RefCount *)local_90)->_vptr_RefCount[3])();
  }
  std::__cxx11::string::~string((string *)&local_88);
  lVar5 = 8;
  uVar6 = 0;
  while( true ) {
    if ((ulong)((long)triangles.
                      super__Vector_base<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)triangles.
                      super__Vector_base<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 4) <= uVar6) break;
    local_88.super___atomic_base<unsigned_long>._M_i =
         *(__atomic_base<unsigned_long> *)
          ((long)triangles.
                 super__Vector_base<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_>._M_impl.
                 super__Vector_impl_data._M_start + lVar5 + -8);
    local_80 = (element_type *)
               CONCAT44(local_80._4_4_,
                        *(undefined4 *)
                         ((long)&(triangles.
                                  super__Vector_base<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar5));
    std::
    vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
    ::emplace_back<embree::SceneGraph::TriangleMeshNode::Triangle>
              (&this_00->triangles,(Triangle *)&local_88);
    uVar6 = uVar6 + 1;
    lVar5 = lVar5 + 0x10;
  }
  (this->path).filename._M_dataplus._M_p = (pointer)this_00;
  (**(code **)((long)(this_00->super_Node).super_RefCount._vptr_RefCount + 0x10))(this_00);
  std::_Vector_base<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_>::~_Vector_base
            (&triangles.super__Vector_base<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_>);
  (**(code **)((long)(this_00->super_Node).super_RefCount._vptr_RefCount + 0x18))(this_00);
  if (pMVar2 != (MaterialNode *)0x0) {
    (*(pMVar2->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  return (Ref<embree::SceneGraph::Node>)(Node *)this;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadBGFMesh(const Ref<XML>& xml) 
  {
    size_t matid = xml->child("materiallist")->body[0].Int();
    Ref<SceneGraph::MaterialNode> material = id2material.at(matid);
    Ref<SceneGraph::TriangleMeshNode> mesh = new SceneGraph::TriangleMeshNode(material,BBox1f(0,1),0);

    mesh->positions.push_back(loadVec3faArray(xml->childOpt("vertex")));
    mesh->normals.push_back(loadVec3faArray(xml->childOpt("normal")));
    mesh->texcoords = loadVec2fArray(xml->childOpt("texcoord"));

    std::vector<Vec4i> triangles = loadVec4iArray(xml->childOpt("prim"));
    for (size_t i=0; i<triangles.size(); i++) 
      mesh->triangles.push_back(SceneGraph::TriangleMeshNode::Triangle(triangles[i].x,triangles[i].y,triangles[i].z));

    return mesh.dynamicCast<SceneGraph::Node>();
  }